

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::MaybeLogToEmail(LogSeverity severity,char *message,size_t len)

{
  long *plVar1;
  long *plVar2;
  string body;
  string to;
  string subject;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((email_logging_severity_ <= severity) || (fLI::FLAGS_logemaillevel <= severity)) {
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,*fLS::FLAGS_alsologtoemail_abi_cxx11_,
               fLS::FLAGS_alsologtoemail_abi_cxx11_[1] + *fLS::FLAGS_alsologtoemail_abi_cxx11_);
    if (DAT_00142c78 != 0) {
      if (local_a8 != 0) {
        std::__cxx11::string::append((char *)&local_b0);
      }
      std::__cxx11::string::_M_append((char *)&local_b0,addresses__abi_cxx11_);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"[LOG] ","");
    plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar2;
      local_70 = (long *)*plVar1;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_c0 = *plVar2;
      lStack_b8 = plVar1[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*plVar1;
    }
    local_c8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    glog_internal_namespace_::ProgramInvocationShortName();
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    hostname_abi_cxx11_();
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,hostname__abi_cxx11_,DAT_00142c98 + hostname__abi_cxx11_);
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::append((char *)&local_d0,(ulong)message);
    SendEmailInternal((char *)local_b0,(char *)local_90,(char *)local_d0,false);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToEmail(LogSeverity severity,
					    const char* message, size_t len) {
  if (severity >= email_logging_severity_ ||
      severity >= FLAGS_logemaillevel) {
    string to(FLAGS_alsologtoemail);
    if (!addresses_.empty()) {
      if (!to.empty()) {
        to += ",";
      }
      to += addresses_;
    }
    const string subject(string("[LOG] ") + LogSeverityNames[severity] + ": " +
                         glog_internal_namespace_::ProgramInvocationShortName());
    string body(hostname());
    body += "\n\n";
    body.append(message, len);

    // should NOT use SendEmail().  The caller of this function holds the
    // log_mutex and SendEmail() calls LOG/VLOG which will block trying to
    // acquire the log_mutex object.  Use SendEmailInternal() and set
    // use_logging to false.
    SendEmailInternal(to.c_str(), subject.c_str(), body.c_str(), false);
  }
}